

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_process_headers_frame(nghttp2_session *session)

{
  nghttp2_inbound_frame *frame;
  nghttp2_stream_state nVar1;
  int iVar2;
  nghttp2_stream *stream;
  
  frame = &session->iframe;
  nghttp2_frame_unpack_headers_payload((nghttp2_headers *)frame,(session->iframe).sbuf.pos);
  stream = (nghttp2_stream *)
           nghttp2_map_find(&session->streams,(session->iframe).frame.hd.stream_id);
  if ((stream != (nghttp2_stream *)0x0) && ((stream->flags & 2) == 0)) {
    nVar1 = stream->state;
    if (nVar1 == NGHTTP2_STREAM_OPENING) {
      iVar2 = (session->iframe).frame.hd.stream_id;
      if ((iVar2 != 0) && (((session->server == '\0' ^ (byte)iVar2) & 1) == 0)) {
        (session->iframe).frame.headers.cat = NGHTTP2_HCAT_RESPONSE;
        iVar2 = nghttp2_session_on_response_headers_received(session,&frame->frame,stream);
        return iVar2;
      }
    }
    else {
      if (nVar1 == NGHTTP2_STREAM_RESERVED) {
        (session->iframe).frame.headers.cat = NGHTTP2_HCAT_PUSH_RESPONSE;
        iVar2 = nghttp2_session_on_push_response_headers_received(session,&frame->frame,stream);
        return iVar2;
      }
      if (nVar1 == NGHTTP2_STREAM_IDLE) goto LAB_0011068a;
    }
    (session->iframe).frame.headers.cat = NGHTTP2_HCAT_HEADERS;
    iVar2 = nghttp2_session_on_headers_received(session,&frame->frame,stream);
    return iVar2;
  }
LAB_0011068a:
  (session->iframe).frame.headers.cat = NGHTTP2_HCAT_REQUEST;
  iVar2 = nghttp2_session_on_request_headers_received(session,&frame->frame);
  return iVar2;
}

Assistant:

static int session_process_headers_frame(nghttp2_session *session) {
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;
  nghttp2_stream *stream;

  nghttp2_frame_unpack_headers_payload(&frame->headers, iframe->sbuf.pos);

  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
  if (!stream) {
    frame->headers.cat = NGHTTP2_HCAT_REQUEST;
    return nghttp2_session_on_request_headers_received(session, frame);
  }

  if (stream->state == NGHTTP2_STREAM_RESERVED) {
    frame->headers.cat = NGHTTP2_HCAT_PUSH_RESPONSE;
    return nghttp2_session_on_push_response_headers_received(session, frame,
                                                             stream);
  }

  if (stream->state == NGHTTP2_STREAM_OPENING &&
      nghttp2_session_is_my_stream_id(session, frame->hd.stream_id)) {
    frame->headers.cat = NGHTTP2_HCAT_RESPONSE;
    return nghttp2_session_on_response_headers_received(session, frame, stream);
  }

  frame->headers.cat = NGHTTP2_HCAT_HEADERS;
  return nghttp2_session_on_headers_received(session, frame, stream);
}